

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ProblemHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this,int info)

{
  int num_values;
  StringRef name;
  IntSuffixHandler suffix_handler;
  
  num_values = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)this,1,2);
  name = TextReader<fmt::Locale>::ReadName(*(TextReader<fmt::Locale> **)this);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  if ((info & 4U) == 0) {
    suffix_handler.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ =
         (BasicMutSuffix<int>)
         BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                   (*(BasicProblem<mp::BasicProblemParams<int>_> **)(*(long *)(this + 0x10) + 8),
                    name,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::IntReader,mp::BasicProblem<mp::BasicProblemParams<int>>::SuffixHandler<int>>
              (this,num_values,1,&suffix_handler);
  }
  else {
    suffix_handler.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ =
         (BasicMutSuffix<int>)
         BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<double>
                   (*(BasicProblem<mp::BasicProblemParams<int>_> **)(*(long *)(this + 0x10) + 8),
                    name,info & 3U);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::DoubleReader,mp::BasicProblem<mp::BasicProblemParams<int>>::SuffixHandler<double>>
              (this,num_values,1,(SuffixHandler<double> *)&suffix_handler);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}